

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O0

RegexPattern *
UnifiedRegex::RegexPattern::New(ScriptContext *scriptContext,Program *program,bool isLiteral)

{
  Recycler *pRVar1;
  RegexPattern *this;
  JavascriptLibrary *library;
  TrackAllocData local_48;
  byte local_19;
  Program *pPStack_18;
  bool isLiteral_local;
  Program *program_local;
  ScriptContext *scriptContext_local;
  
  local_19 = isLiteral;
  pPStack_18 = program;
  program_local = (Program *)scriptContext;
  pRVar1 = Js::ScriptContext::GetRecycler(scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexPattern.cpp"
             ,0x19);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  this = (RegexPattern *)new<Memory::Recycler>(0x38,pRVar1,0x4642b0);
  library = Js::ScriptContext::GetLibrary((ScriptContext *)program_local);
  RegexPattern(this,library,pPStack_18,(bool)(local_19 & 1));
  return this;
}

Assistant:

RegexPattern *RegexPattern::New(Js::ScriptContext *scriptContext, Program* program, bool isLiteral)
    {
        return
            RecyclerNewFinalized(
                scriptContext->GetRecycler(),
                RegexPattern,
                scriptContext->GetLibrary(),
                program,
                isLiteral);
    }